

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monsters.cpp
# Opt level: O0

char randmonster(bool wander)

{
  int iVar1;
  int iVar2;
  char *local_20;
  char *mons;
  int d;
  bool wander_local;
  
  if (wander) {
    local_20 = wand_mons;
  }
  else {
    local_20 = lvl_mons;
  }
  do {
    iVar2 = level;
    iVar1 = rnd(10);
    mons._0_4_ = iVar2 + iVar1 + -6;
    if ((int)mons < 0) {
      mons._0_4_ = rnd(5);
    }
    if (0x19 < (int)mons) {
      iVar2 = rnd(5);
      mons._0_4_ = iVar2 + 0x15;
    }
  } while (local_20[(int)mons] == '\0');
  return local_20[(int)mons];
}

Assistant:

char randmonster(bool wander)
{
    int d;
    char *mons;

    mons = (wander ? wand_mons : lvl_mons);
    do
    {
        d = level + (rnd(10) - 6);
        if (d < 0)
            d = rnd(5);
        if (d > 25)
            d = rnd(5) + 21;
    } while (mons[d] == 0);
    return mons[d];
}